

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.h
# Opt level: O3

void __thiscall adios2::query::QueryComposite::Print(QueryComposite *this)

{
  pointer ppQVar1;
  pointer ppQVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Composite query",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  ppQVar1 = (this->m_Nodes).
            super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppQVar2 = (this->m_Nodes).
                 super__Vector_base<adios2::query::QueryBase_*,_std::allocator<adios2::query::QueryBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppQVar2 != ppQVar1;
      ppQVar2 = ppQVar2 + 1) {
    (*(*ppQVar2)->_vptr_QueryBase[3])();
  }
  return;
}

Assistant:

void Print()
    {
        std::cout << " Composite query" << std::endl;
        for (auto n : m_Nodes)
            n->Print();
    }